

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::negativeSampling(Model *this,int32_t target,real lr)

{
  element_type *peVar1;
  int32_t in_ESI;
  Model *in_RDI;
  undefined4 in_XMM0_Da;
  real rVar2;
  int32_t n;
  real loss;
  int local_18;
  float lr_00;
  
  lr_00 = 0.0;
  Vector::zero((Vector *)CONCAT44(in_ESI,in_XMM0_Da));
  local_18 = 0;
  while( true ) {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16c9b1);
    if (peVar1->neg < local_18) break;
    if (local_18 == 0) {
      rVar2 = binaryLogistic(in_RDI,in_ESI,SUB41((uint)in_XMM0_Da >> 0x18,0),lr_00);
      lr_00 = rVar2 + lr_00;
    }
    else {
      getNegative((Model *)CONCAT44(in_ESI,in_XMM0_Da),(int32_t)lr_00);
      rVar2 = binaryLogistic(in_RDI,in_ESI,SUB41((uint)in_XMM0_Da >> 0x18,0),lr_00);
      lr_00 = rVar2 + lr_00;
    }
    local_18 = local_18 + 1;
  }
  return lr_00;
}

Assistant:

real Model::negativeSampling(int32_t target, real lr) {
  real loss = 0.0;
  grad_.zero();
  for (int32_t n = 0; n <= args_->neg; n++) {
    if (n == 0) {
      loss += binaryLogistic(target, true, lr);
    } else {
      loss += binaryLogistic(getNegative(target), false, lr);
    }
  }
  return loss;
}